

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

Data * Data::divide(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  long lVar2;
  Data *pDVar3;
  pointer ppDVar4;
  
  ppDVar4 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (*ppDVar4 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)0x0;
    lVar2 = __dynamic_cast(*ppDVar4,&typeinfo,&Integer::typeinfo,0);
    if (lVar2 != 0) {
      pDVar3 = Integer::divide(dataPara);
      ppDVar4 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
  }
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (; ppDVar4 != ppDVar1; ppDVar4 = ppDVar4 + 1) {
    check(*ppDVar4);
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            (&dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>);
  operator_delete(dataPara);
  return pDVar3;
}

Assistant:

Data *Data::divide(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::divide(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}